

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_deviation(lysp_yang_ctx *ctx,lysp_deviation **deviations)

{
  lysp_ext_instance **pplVar1;
  long *plVar2;
  size_t len;
  LY_ERR LVar3;
  long *plVar4;
  long lVar5;
  lysp_ext_instance **pplVar6;
  char *format;
  ly_stmt parent_stmt;
  lysp_ext_instance *plVar7;
  ly_ctx *plVar8;
  char *pcVar9;
  lysp_deviation *plVar10;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  lysp_ext_instance **in_stack_ffffffffffffff70;
  ly_stmt local_7c;
  char *local_78;
  size_t local_70;
  lysp_ext_instance **local_68;
  lysp_ext_instance **local_60;
  char *local_58;
  lysf_ctx local_50;
  
  local_50.mod = (lys_module *)0x0;
  local_50.ext_set.size = 0;
  local_50.ext_set.count = 0;
  local_50.ext_set.field_2.dnodes = (lyd_node **)0x0;
  if (ctx == (lysp_yang_ctx *)0x0) {
    local_50.ctx = (ly_ctx *)0x0;
  }
  else {
    local_50.ctx = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  plVar10 = *deviations;
  if (plVar10 == (lysp_deviation *)0x0) {
    plVar4 = (long *)malloc(0x30);
    if (plVar4 == (long *)0x0) goto LAB_00179ac6;
    *plVar4 = 1;
    lVar5 = 1;
  }
  else {
    plVar7 = plVar10[-1].exts;
    plVar10[-1].exts = (lysp_ext_instance *)((long)&plVar7->name + 1);
    plVar4 = (long *)realloc(&plVar10[-1].exts,(long)plVar7 * 0x28 + 0x30);
    if (plVar4 == (long *)0x0) {
      (*deviations)[-1].exts = (lysp_ext_instance *)((long)&(*deviations)[-1].exts[-1].exts + 7);
LAB_00179ac6:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_deviation");
      return LY_EMEM;
    }
    lVar5 = *plVar4;
  }
  *deviations = (lysp_deviation *)(plVar4 + 1);
  plVar2 = plVar4 + lVar5 * 5;
  plVar10 = (lysp_deviation *)(plVar2 + -4);
  plVar2[-2] = 0;
  plVar2[-1] = 0;
  plVar10->nodeid = (char *)0x0;
  plVar2[-3] = 0;
  *plVar2 = 0;
  LVar3 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_78,&local_58,&local_70);
  len = local_70;
  if (LVar3 != LY_SUCCESS) goto LAB_00179a90;
  if (local_70 == 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_log(plVar8,LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.",
           "deviation");
  }
  if (local_58 == (char *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar9 = local_78;
    if (len == 0) {
      pcVar9 = "";
    }
    LVar3 = lydict_insert(plVar8,pcVar9,len,(char **)plVar10);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar3 = lydict_insert_zc(plVar8,local_78,(char **)plVar10);
  }
  if ((LVar3 != LY_SUCCESS) ||
     (LVar3 = get_keyword(ctx,&local_7c,&local_78,&local_70), LVar3 != LY_SUCCESS))
  goto LAB_00179a90;
  pplVar1 = (lysp_ext_instance **)(plVar4 + lVar5 * 5);
  if (local_7c == LY_STMT_SYNTAX_SEMICOLON) {
LAB_00179c58:
    if (pplVar1[-1] != (lysp_ext_instance *)0x0) {
      return LY_SUCCESS;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
    pcVar9 = "deviate";
LAB_00179e0c:
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar9,"deviation");
  }
  else {
    if (local_7c == LY_STMT_SYNTAX_LEFT_BRACE) {
      LVar3 = get_keyword(ctx,&local_7c,&local_78,&local_70);
      if (LVar3 != LY_SUCCESS) goto LAB_00179a90;
      if (local_7c != LY_STMT_SYNTAX_RIGHT_BRACE) {
        local_60 = pplVar1 + -2;
        local_68 = pplVar1 + -1;
        do {
          if ((int)local_7c < 0xf0000) {
            if (local_7c == LY_STMT_DESCRIPTION) {
              plVar7 = pplVar1[-3];
              parent_stmt = LY_STMT_DESCRIPTION;
              pplVar6 = pplVar1 + -3;
LAB_00179d57:
              LVar3 = parse_text_field(ctx,plVar7,parent_stmt,(uint32_t)pplVar6,(char **)0x2,
                                       Y_IDENTIF_ARG,(uint16_t *)pplVar1,in_stack_ffffffffffffff70);
            }
            else {
              if (local_7c != LY_STMT_DEVIATE) {
LAB_00179e29:
                if (ctx == (lysp_yang_ctx *)0x0) {
                  plVar8 = (ly_ctx *)0x0;
                }
                else {
                  plVar8 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar9 = lyplg_ext_stmt2str(local_7c);
                format = "Invalid keyword \"%s\" as a child of \"%s\".";
                goto LAB_00179e0c;
              }
              LVar3 = parse_deviate(ctx,(lysp_deviate **)local_68);
            }
          }
          else {
            if (local_7c != LY_STMT_EXTENSION_INSTANCE) {
              if (local_7c != LY_STMT_REFERENCE) goto LAB_00179e29;
              plVar7 = *local_60;
              parent_stmt = LY_STMT_REFERENCE;
              pplVar6 = local_60;
              goto LAB_00179d57;
            }
            LVar3 = parse_ext(ctx,local_78,local_70,plVar10,LY_STMT_DEVIATION,0,pplVar1);
          }
          if ((LVar3 != LY_SUCCESS) ||
             (LVar3 = get_keyword(ctx,&local_7c,&local_78,&local_70), LVar3 != LY_SUCCESS))
          goto LAB_00179a90;
        } while (local_7c != LY_STMT_SYNTAX_RIGHT_BRACE);
        if ((*pplVar1 != (lysp_ext_instance *)0x0) &&
           (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,*pplVar1,'\x01',(uint32_t *)0x0),
           LVar3 != LY_SUCCESS)) goto LAB_00179a90;
      }
      goto LAB_00179c58;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar9 = lyplg_ext_stmt2str(local_7c);
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\".",
            pcVar9);
  }
  LVar3 = LY_EVALID;
LAB_00179a90:
  lysp_deviation_free(&local_50,plVar10);
  plVar10 = *deviations;
  pplVar1 = &plVar10[-1].exts;
  *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)[-1].exts + 7);
  if (*pplVar1 == (lysp_ext_instance *)0x0) {
    free(&plVar10[-1].exts);
    *deviations = (lysp_deviation *)0x0;
  }
  return LVar3;
}

Assistant:

LY_ERR
parse_deviation(struct lysp_yang_ctx *ctx, struct lysp_deviation **deviations)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_deviation *dev;
    struct lysf_ctx fctx = {.ctx = PARSER_CTX(ctx)};

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *deviations, dev, LY_EMEM);

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);
    CHECK_NONEMPTY(ctx, word_len, "deviation");
    INSERT_WORD_GOTO(ctx, buf, dev->nodeid, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            ret = parse_text_field(ctx, dev->dsc, LY_STMT_DESCRIPTION, 0, &dev->dsc, Y_STR_ARG, NULL, &dev->exts);
            LY_CHECK_GOTO(ret, cleanup);
            break;
        case LY_STMT_DEVIATE:
            LY_CHECK_GOTO(ret = parse_deviate(ctx, &dev->deviates), cleanup);
            break;
        case LY_STMT_REFERENCE:
            ret = parse_text_field(ctx, dev->ref, LY_STMT_REFERENCE, 0, &dev->ref, Y_STR_ARG, NULL, &dev->exts);
            LY_CHECK_GOTO(ret, cleanup);
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, dev, LY_STMT_DEVIATION, 0, &dev->exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "deviation");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, dev->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!dev->deviates) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "deviate", "deviation");
        ret = LY_EVALID;
        goto cleanup;
    }

cleanup:
    if (ret) {
        lysp_deviation_free(&fctx, dev);
        LY_ARRAY_DECREMENT_FREE(*deviations);
    }
    return ret;
}